

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void pbrt::CPURender(ParsedScene *parsedScene)

{
  float fVar1;
  bool bVar2;
  undefined1 uVar3;
  ParsedScene *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *spectrumTextures_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  *namedMaterialsOut;
  size_type sVar4;
  pointer ppVar5;
  RGBColorSpace *__x;
  FileLoc *loc;
  pointer pIVar6;
  Allocator alloc_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *floatTextures_00;
  AnimatedPrimitive *this_00;
  vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *materialsOut;
  char *fmt;
  long in_RDI;
  Float FVar7;
  Float FVar8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>
  *m;
  iterator __end1_5;
  iterator __begin1_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  *__range1_5;
  bool haveLights;
  unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> integrator;
  RGBColorSpace *integratorColorSpace;
  MediumHandle *in_stack_00000260;
  CameraTransform *in_stack_00000268;
  PrimitiveHandle accel;
  ParameterDictionary *in_stack_00000278;
  string *in_stack_00000280;
  Allocator in_stack_00000288;
  FileLoc *in_stack_000002a0;
  iterator iter;
  InstanceSceneEntity *inst_1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *__range1_4;
  PrimitiveHandle bvh;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> movingInstancePrimitives;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> instancePrimitives;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>
  *inst;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
  *__range1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
  instanceDefinitions;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> animatedPrimitives;
  anon_class_56_7_455aa864 CreatePrimitivesForAnimatedShapes;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> primitives;
  anon_class_56_7_455aa864 CreatePrimitivesForShapes;
  anon_class_16_2_c82bbf6a getAlphaTexture;
  LightHandle l;
  MediumHandle outsideMedium;
  LightSceneEntity *light;
  iterator __end1_2;
  iterator __begin1_2;
  vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *__range1_2;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *namedMtl;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  *__range1_1;
  SceneEntity *mtl;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *__range1;
  bool haveSubsurface;
  vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> materials;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  namedMaterials;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  spectrumTextures;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  floatTextures;
  SamplerHandle sampler;
  CameraHandle camera;
  MediumHandle cameraMedium;
  FilmHandle film;
  Float exposureTime;
  FilterHandle filter;
  anon_class_16_2_f001ee1d findMedium;
  bool haveScatteringMedia;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  media;
  Allocator alloc;
  string *in_stack_fffffffffffff8e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  *this_01;
  ParameterDictionary *in_stack_fffffffffffff8f0;
  AnimatedTransform *renderFromPrimitive;
  RGBColorSpace *__lhs;
  CameraHandle *in_stack_fffffffffffff8f8;
  AnimatedPrimitive *in_stack_fffffffffffff900;
  FileLoc *in_stack_fffffffffffff908;
  string *in_stack_fffffffffffff910;
  undefined6 in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff91e;
  undefined1 in_stack_fffffffffffff91f;
  undefined1 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff921;
  undefined1 in_stack_fffffffffffff922;
  undefined1 in_stack_fffffffffffff923;
  undefined1 in_stack_fffffffffffff924;
  undefined1 in_stack_fffffffffffff925;
  undefined1 in_stack_fffffffffffff926;
  undefined1 in_stack_fffffffffffff927;
  key_type *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  __normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
  in_stack_fffffffffffff938;
  __normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
  in_stack_fffffffffffff940;
  int line;
  const_iterator in_stack_fffffffffffff948;
  string *in_stack_fffffffffffff950;
  LogLevel level;
  Allocator in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  Float in_stack_fffffffffffff964;
  ParameterDictionary *in_stack_fffffffffffff968;
  iterator in_stack_fffffffffffff970;
  Allocator in_stack_fffffffffffff978;
  FilmHandle *in_stack_fffffffffffff9c0;
  CameraTransform *in_stack_fffffffffffff9c8;
  MediumHandle *in_stack_fffffffffffff9d0;
  ParameterDictionary *in_stack_fffffffffffff9d8;
  ParsedScene *in_stack_fffffffffffff9e0;
  Allocator in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *in_stack_fffffffffffffac0
  ;
  anon_class_56_7_455aa864 *in_stack_fffffffffffffac8;
  _Self local_528;
  _Self local_520;
  undefined1 *local_518;
  byte local_509;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  local_508;
  vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
  *in_stack_fffffffffffffb30;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  in_stack_fffffffffffffb38;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_480;
  _Self local_478;
  _Self local_470;
  reference local_468;
  undefined8 in_stack_fffffffffffffba0;
  __normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
  in_stack_fffffffffffffba8;
  BVHAggregate *in_stack_fffffffffffffbb0;
  PrimitiveHandle *in_stack_fffffffffffffc08;
  SamplerHandle *in_stack_fffffffffffffc10;
  CameraHandle *in_stack_fffffffffffffc18;
  ParameterDictionary *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  iterator in_stack_fffffffffffffc40;
  iterator in_stack_fffffffffffffc48;
  reference in_stack_fffffffffffffc50;
  _Self local_3a8;
  _Self local_3a0;
  long local_398;
  PrimitiveHandle *local_360;
  PrimitiveHandle *local_358;
  PrimitiveHandle *local_350;
  PrimitiveHandle *local_348;
  AnimatedTransform **local_320;
  undefined1 **local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 **local_300;
  long local_2f8;
  undefined1 *local_2f0;
  AnimatedTransform **local_2d0;
  undefined1 **local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 **local_2b0;
  long local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  AnimatedTransform **local_290;
  AnimatedTransform *local_288;
  reference local_268;
  LightSceneEntity *local_260;
  __normal_iterator<pbrt::LightSceneEntity_*,_std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>_>
  local_258;
  long local_250;
  undefined1 local_248 [24];
  reference local_230;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *local_228;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
  local_220;
  long local_218;
  reference local_210;
  SceneEntity *local_208;
  __normal_iterator<pbrt::SceneEntity_*,_std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>_>
  local_200;
  long local_1f8;
  byte local_1e9;
  AnimatedTransform *local_1e8;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [48];
  AnimatedTransform *local_198;
  undefined1 in_stack_fffffffffffffe97;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *in_stack_fffffffffffffe98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *in_stack_fffffffffffffea0;
  ParsedScene *in_stack_fffffffffffffea8;
  Allocator in_stack_fffffffffffffeb0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  float local_80;
  AnimatedTransform *local_70;
  undefined1 *local_60;
  byte *local_58;
  byte local_49;
  AnimatedTransform *local_48;
  undefined1 local_40 [48];
  AnimatedTransform *local_10;
  long local_8;
  
  local_8 = in_RDI;
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff8f0);
  local_48 = local_10;
  ParsedScene::CreateMedia_abi_cxx11_(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8);
  local_49 = 0;
  local_58 = &local_49;
  local_70 = local_10;
  local_60 = local_40;
  FilterHandle::Create
            (in_stack_fffffffffffff950,(ParameterDictionary *)in_stack_fffffffffffff948._M_current,
             (FileLoc *)in_stack_fffffffffffff940._M_current,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffff927,
                      CONCAT16(in_stack_fffffffffffff926,
                               CONCAT15(in_stack_fffffffffffff925,
                                        CONCAT14(in_stack_fffffffffffff924,
                                                 CONCAT13(in_stack_fffffffffffff923,
                                                          CONCAT12(in_stack_fffffffffffff922,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff921,
                                                  in_stack_fffffffffffff920))))))));
  FVar7 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,0.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffff927,
                      CONCAT16(in_stack_fffffffffffff926,
                               CONCAT15(in_stack_fffffffffffff925,
                                        CONCAT14(in_stack_fffffffffffff924,
                                                 CONCAT13(in_stack_fffffffffffff923,
                                                          CONCAT12(in_stack_fffffffffffff922,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff921,
                                                  in_stack_fffffffffffff920))))))));
  FVar8 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,0.0);
  fVar1 = FVar7 - FVar8;
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = fVar1;
  if (fVar1 <= 0.0) {
    ErrorExit((FileLoc *)in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
  }
  alloc_00.memoryResource = (memory_resource *)(local_8 + 0x10);
  FilterHandle::FilterHandle
            ((FilterHandle *)in_stack_fffffffffffff8f0,(FilterHandle *)in_stack_fffffffffffff8e8);
  FilmHandle::Create((string *)in_stack_fffffffffffff970._M_node,in_stack_fffffffffffff968,
                     in_stack_fffffffffffff964,
                     (FilterHandle *)in_stack_fffffffffffff958.memoryResource,
                     (FileLoc *)in_stack_fffffffffffff950,in_stack_fffffffffffff978);
  CPURender::anon_class_16_2_f001ee1d::operator()
            ((anon_class_16_2_f001ee1d *)
             CONCAT17(in_stack_fffffffffffff91f,
                      CONCAT16(in_stack_fffffffffffff91e,in_stack_fffffffffffff918)),
             in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  floatTextures_00 =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
        *)(local_8 + 0x330);
  this = (ParsedScene *)(local_8 + 0x350);
  MediumHandle::MediumHandle
            ((MediumHandle *)in_stack_fffffffffffff8f0,(MediumHandle *)in_stack_fffffffffffff8e8);
  spectrumTextures_00 =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
        *)(local_8 + 0x3d0);
  FilmHandle::FilmHandle
            ((FilmHandle *)in_stack_fffffffffffff8f0,(FilmHandle *)in_stack_fffffffffffff8e8);
  this_00 = (AnimatedPrimitive *)(local_8 + 0x3b8);
  renderFromPrimitive = local_10;
  CameraHandle::Create
            ((string *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0
             ,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
             (FileLoc *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
             in_stack_fffffffffffff9e8);
  materialsOut = (vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *)
                 (local_8 + 0xb0);
  namedMaterialsOut =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
        *)(local_8 + 0xd0);
  CameraHandle::GetFilm(in_stack_fffffffffffff8f8);
  FilmHandle::FullResolution((FilmHandle *)this_00);
  SamplerHandle::Create
            ((string *)in_stack_fffffffffffff970._M_node,in_stack_fffffffffffff968,
             (Point2i *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             (FileLoc *)in_stack_fffffffffffff958.memoryResource,in_stack_fffffffffffff978);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
         *)0x51867e);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
         *)0x518693);
  local_198 = local_10;
  ParsedScene::CreateTextures
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffe97);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
         *)0x5186e2);
  std::vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>::vector
            ((vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *)0x5186f7);
  local_1e8 = local_10;
  ParsedScene::CreateMaterials
            (this,floatTextures_00,spectrumTextures_00,alloc_00,namedMaterialsOut,materialsOut);
  local_1e9 = 0;
  local_1f8 = local_8 + 0x740;
  local_200._M_current =
       (SceneEntity *)
       std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::begin
                 ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)this_00);
  local_208 = (SceneEntity *)
              std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::end
                        ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<pbrt::SceneEntity_*,_std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>_>
                             *)renderFromPrimitive,
                            (__normal_iterator<pbrt::SceneEntity_*,_std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>_>
                             *)this_00), bVar2) {
    local_210 = __gnu_cxx::
                __normal_iterator<pbrt::SceneEntity_*,_std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>_>
                ::operator*(&local_200);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            renderFromPrimitive,(char *)this_00);
    if (bVar2) {
      local_1e9 = 1;
    }
    __gnu_cxx::
    __normal_iterator<pbrt::SceneEntity_*,_std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>_>
    ::operator++(&local_200);
  }
  local_218 = local_8 + 0x728;
  local_220._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                   *)this_00);
  local_228 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                        *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
                             *)renderFromPrimitive,
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
                             *)this_00), bVar2) {
    local_230 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
                ::operator*(&local_220);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            renderFromPrimitive,(char *)this_00);
    if (bVar2) {
      local_1e9 = 1;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
    ::operator++(&local_220);
  }
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)0x5188ff);
  std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::size
            ((vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *)
             (local_8 + 0x7b8));
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::size
            ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)(local_8 + 2000));
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::reserve
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928);
  local_250 = local_8 + 0x7b8;
  local_258._M_current =
       (LightSceneEntity *)
       std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::begin
                 ((vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *)this_00
                 );
  local_260 = (LightSceneEntity *)
              std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::end
                        ((vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *)
                         this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<pbrt::LightSceneEntity_*,_std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>_>
                             *)renderFromPrimitive,
                            (__normal_iterator<pbrt::LightSceneEntity_*,_std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>_>
                             *)this_00), bVar2) {
    local_268 = __gnu_cxx::
                __normal_iterator<pbrt::LightSceneEntity_*,_std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>_>
                ::operator*(&local_258);
    CPURender::anon_class_16_2_f001ee1d::operator()
              ((anon_class_16_2_f001ee1d *)
               CONCAT17(in_stack_fffffffffffff91f,
                        CONCAT16(in_stack_fffffffffffff91e,in_stack_fffffffffffff918)),
               in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    bVar2 = AnimatedTransform::IsAnimated
                      (&(local_268->super_TransformedSceneEntity).renderFromObject);
    if (bVar2) {
      Warning((FileLoc *)renderFromPrimitive,(char *)this_00);
    }
    MediumHandle::MediumHandle((MediumHandle *)renderFromPrimitive,(MediumHandle *)this_00);
    this_00 = (AnimatedPrimitive *)&(local_268->super_TransformedSceneEntity).super_SceneEntity.loc;
    local_288 = local_10;
    renderFromPrimitive = local_10;
    LightHandle::Create(in_stack_00000280,in_stack_00000278,
                        (Transform *)
                        accel.
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        .bits,in_stack_00000268,in_stack_00000260,in_stack_000002a0,
                        in_stack_00000288);
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::push_back
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
               in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
    __gnu_cxx::
    __normal_iterator<pbrt::LightSceneEntity_*,_std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>_>
    ::operator++(&local_258);
  }
  local_298 = &stack0xfffffffffffffea0;
  local_2d0 = &local_10;
  local_2c8 = &local_298;
  local_2c0 = local_1c8;
  local_2b8 = local_1e0;
  local_2b0 = &local_60;
  local_2a8 = local_8;
  local_2a0 = local_248;
  local_290 = local_2d0;
  CPURender::anon_class_56_7_455aa864::operator()
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_320 = &local_10;
  local_318 = &local_298;
  local_310 = local_1c8;
  local_308 = local_1e0;
  local_300 = &local_60;
  local_2f8 = local_8;
  local_2f0 = local_248;
  CPURender::anon_class_56_7_455aa864::operator()
            ((anon_class_56_7_455aa864 *)in_stack_fffffffffffffb38.bits,in_stack_fffffffffffffb30);
  local_348 = (PrimitiveHandle *)
              std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::end
                        ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                         this_00);
  __gnu_cxx::
  __normal_iterator<pbrt::PrimitiveHandle_const*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>
  ::__normal_iterator<pbrt::PrimitiveHandle*>
            ((__normal_iterator<const_pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
              *)renderFromPrimitive,
             (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
              *)this_00);
  local_350 = (PrimitiveHandle *)
              std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::begin
                        ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                         this_00);
  local_358 = (PrimitiveHandle *)
              std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::end
                        ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                         this_00);
  local_360 = (PrimitiveHandle *)
              std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
              insert<__gnu_cxx::__normal_iterator<pbrt::PrimitiveHandle*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>,void>
                        ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                         in_stack_fffffffffffff930,in_stack_fffffffffffff948,
                         in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
         *)0x518d2f);
  local_398 = local_8 + 0x830;
  local_3a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                *)this_00);
  local_3a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
              *)this_00);
  while( true ) {
    bVar2 = std::operator!=(&local_3a0,&local_3a8);
    if (!bVar2) {
      std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::begin
                ((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
                 this_00);
      std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::end
                ((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
                 this_00);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
                            *)renderFromPrimitive,
                           (__normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
                            *)this_00);
        if (!bVar2) {
          PrimitiveHandle::TaggedPointer((PrimitiveHandle *)renderFromPrimitive,this_00);
          bVar2 = std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::empty
                            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                              *)in_stack_fffffffffffff900);
          if (!bVar2) {
            in_stack_fffffffffffff940._M_current = (PrimitiveHandle *)(local_8 + 0x290);
            in_stack_fffffffffffff948._M_current = (PrimitiveHandle *)&stack0xfffffffffffffb38;
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       renderFromPrimitive,
                       (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       this_00);
            CreateAccelerator((string *)in_stack_fffffffffffff978.memoryResource,
                              (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                               *)in_stack_fffffffffffff970._M_node,in_stack_fffffffffffff968);
            PrimitiveHandle::operator=((PrimitiveHandle *)renderFromPrimitive,&this_00->primitive);
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       in_stack_fffffffffffff900);
          }
          __x = ParameterDictionary::ColorSpace((ParameterDictionary *)(local_8 + 0x30));
          fmt = (char *)(local_8 + 0x150);
          loc = (FileLoc *)(local_8 + 0x170);
          __lhs = __x;
          CameraHandle::CameraHandle((CameraHandle *)renderFromPrimitive,(CameraHandle *)this_00);
          SamplerHandle::SamplerHandle
                    ((SamplerHandle *)renderFromPrimitive,(SamplerHandle *)this_00);
          PrimitiveHandle::PrimitiveHandle
                    ((PrimitiveHandle *)renderFromPrimitive,&this_00->primitive);
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                     in_stack_fffffffffffff940._M_current,
                     (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)__x);
          this_01 = &local_508;
          Integrator::Create(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                             in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08,
                             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             in_stack_fffffffffffffc40._M_node,
                             (RGBColorSpace *)in_stack_fffffffffffffc48._M_node,
                             (FileLoc *)in_stack_fffffffffffffc50);
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                     in_stack_fffffffffffff900);
          if (((((local_49 & 1) != 0) &&
               (in_stack_fffffffffffff927 =
                     std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff927)) &&
              (in_stack_fffffffffffff926 =
                    std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff926)) &&
             ((in_stack_fffffffffffff925 =
                    std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff925 &&
              (in_stack_fffffffffffff924 =
                    std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff924)))) {
            Warning<std::__cxx11::string&>
                      ((char *)CONCAT17(in_stack_fffffffffffff927,
                                        CONCAT16(in_stack_fffffffffffff926,
                                                 CONCAT15(in_stack_fffffffffffff925,
                                                          CONCAT14(in_stack_fffffffffffff924,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff923,
                                                  CONCAT12(in_stack_fffffffffffff922,
                                                           CONCAT11(in_stack_fffffffffffff921,
                                                                    in_stack_fffffffffffff920)))))))
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffff91f,
                                 CONCAT16(in_stack_fffffffffffff91e,in_stack_fffffffffffff918)));
          }
          bVar2 = std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::empty
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             in_stack_fffffffffffff900);
          local_509 = (bVar2 ^ 0xffU) & 1;
          local_518 = local_40;
          local_520._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
               ::begin(this_01);
          local_528._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
               ::end(this_01);
          while( true ) {
            bVar2 = std::operator!=(&local_520,&local_528);
            level = (LogLevel)((ulong)in_stack_fffffffffffff950 >> 0x20);
            line = (int)((ulong)in_stack_fffffffffffff940._M_current >> 0x20);
            if (!bVar2) break;
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>
            ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>
                         *)0x5197d2);
            in_stack_fffffffffffff923 = MediumHandle::IsEmissive((MediumHandle *)__lhs);
            local_509 = (local_509 & 1) != 0 || (bool)in_stack_fffffffffffff923;
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>
                          *)__lhs);
          }
          if ((((local_509 & 1) == 0) &&
              (in_stack_fffffffffffff922 =
                    std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff922)) &&
             (in_stack_fffffffffffff921 =
                   std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff921)) {
            Warning<>((char *)CONCAT17(in_stack_fffffffffffff927,
                                       CONCAT16(in_stack_fffffffffffff926,
                                                CONCAT15(in_stack_fffffffffffff925,
                                                         CONCAT14(in_stack_fffffffffffff924,
                                                                  CONCAT13(in_stack_fffffffffffff923
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffff922,
                                                  CONCAT11(in_stack_fffffffffffff921,
                                                           in_stack_fffffffffffff920))))))));
          }
          uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,(char *)this_01);
          if (((bool)uVar3) &&
             (in_stack_fffffffffffff91f =
                   std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__lhs,(char *)this_01), (bool)in_stack_fffffffffffff91f)) {
            Warning<std::__cxx11::string&>
                      (loc,fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff927,
                                        CONCAT16(in_stack_fffffffffffff926,
                                                 CONCAT15(in_stack_fffffffffffff925,
                                                          CONCAT14(in_stack_fffffffffffff924,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff923,
                                                  CONCAT12(in_stack_fffffffffffff922,
                                                           CONCAT11(in_stack_fffffffffffff921,uVar3)
                                                          )))))));
          }
          if (((local_1e9 & 1) != 0) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,(char *)this_01), bVar2)) {
            Warning<std::__cxx11::string&>
                      ((char *)CONCAT17(in_stack_fffffffffffff927,
                                        CONCAT16(in_stack_fffffffffffff926,
                                                 CONCAT15(in_stack_fffffffffffff925,
                                                          CONCAT14(in_stack_fffffffffffff924,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff923,
                                                  CONCAT12(in_stack_fffffffffffff922,
                                                           CONCAT11(in_stack_fffffffffffff921,uVar3)
                                                          )))))),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff91f,CONCAT16(bVar2,in_stack_fffffffffffff918))
                      );
          }
          if (LOGGING_LogLevel < 1) {
            GetCurrentRSS();
            Log<unsigned_long>(level,(char *)in_stack_fffffffffffff948._M_current,line,(char *)__x,
                               (unsigned_long *)loc);
          }
          pIVar6 = std::unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>::
                   operator->((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                               *)0x5199bf);
          (*pIVar6->_vptr_Integrator[3])();
          if (LOGGING_LogLevel < 1) {
            GetCurrentRSS();
            Log<unsigned_long>(level,(char *)in_stack_fffffffffffff948._M_current,line,(char *)__x,
                               (unsigned_long *)loc);
          }
          PtexTextureBase::ReportStats();
          ImageTextureBase::ClearCache();
          FreeBufferCaches();
          std::unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>::~unique_ptr
                    ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                     in_stack_fffffffffffff900);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                  *)0x519a48);
          std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
                    ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                     in_stack_fffffffffffff900);
          std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
                    ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                     in_stack_fffffffffffff900);
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                     in_stack_fffffffffffff900);
          std::vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>::~vector
                    ((vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *)
                     in_stack_fffffffffffff900);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                  *)0x519a89);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                  *)0x519a96);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                  *)0x519aa3);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
                  *)0x519ab0);
          return;
        }
        local_468 = __gnu_cxx::
                    __normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
                    ::operator*((__normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
                                 *)&stack0xfffffffffffffba8);
        in_stack_fffffffffffff970 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                     *)this_00,(key_type *)0x51920e);
        local_470._M_node = in_stack_fffffffffffff970._M_node;
        local_478._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                    *)this_00);
        bVar2 = std::operator==(&local_470,&local_478);
        if (bVar2) break;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>
                               *)0x519285);
        in_stack_fffffffffffff968 = (ParameterDictionary *)&ppVar5->second;
        TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        ::TaggedPointer(&local_480,(nullptr_t)0x0);
        bVar2 = TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                ::operator==((TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                              *)in_stack_fffffffffffff968,&local_480);
        if (!bVar2) {
          if (local_468->renderFromInstance == (Transform *)0x0) {
            in_stack_fffffffffffff950 = (string *)operator_new(0x2c0);
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>
                          *)0x5193b1);
            PrimitiveHandle::PrimitiveHandle
                      ((PrimitiveHandle *)renderFromPrimitive,&this_00->primitive);
            AnimatedPrimitive::AnimatedPrimitive
                      (in_stack_fffffffffffff900,(PrimitiveHandle *)in_stack_fffffffffffff8f8,
                       renderFromPrimitive);
            PrimitiveHandle::TaggedPointer<pbrt::AnimatedPrimitive>
                      ((PrimitiveHandle *)renderFromPrimitive,this_00);
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::push_back
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       renderFromPrimitive,&this_00->primitive);
          }
          else {
            operator_new(0x10);
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>
                          *)0x519302);
            PrimitiveHandle::PrimitiveHandle
                      ((PrimitiveHandle *)renderFromPrimitive,&this_00->primitive);
            TransformedPrimitive::TransformedPrimitive
                      ((TransformedPrimitive *)in_stack_fffffffffffff900,
                       (PrimitiveHandle *)in_stack_fffffffffffff8f8,
                       &renderFromPrimitive->startTransform);
            PrimitiveHandle::TaggedPointer<pbrt::TransformedPrimitive>
                      ((PrimitiveHandle *)renderFromPrimitive,(TransformedPrimitive *)this_00);
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::push_back
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       renderFromPrimitive,&this_00->primitive);
          }
        }
        __gnu_cxx::
        __normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
        ::operator++((__normal_iterator<pbrt::InstanceSceneEntity_*,_std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
                      *)&stack0xfffffffffffffba8);
      }
      ErrorExit<std::__cxx11::string_const&>
                ((FileLoc *)in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff927,
                          CONCAT16(in_stack_fffffffffffff926,
                                   CONCAT15(in_stack_fffffffffffff925,
                                            CONCAT14(in_stack_fffffffffffff924,
                                                     CONCAT13(in_stack_fffffffffffff923,
                                                              CONCAT12(in_stack_fffffffffffff922,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff921,
                                                  in_stack_fffffffffffff920))))))));
    }
    in_stack_fffffffffffffc50 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>
         ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>
                      *)0x518d9a);
    in_stack_fffffffffffffc48 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                 *)this_00,(key_type *)0x518db7);
    in_stack_fffffffffffffc40 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                *)this_00);
    bVar2 = std::operator!=((_Self *)&stack0xfffffffffffffc48,(_Self *)&stack0xfffffffffffffc40);
    if (bVar2) break;
    CPURender::anon_class_56_7_455aa864::operator()
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    CPURender::anon_class_56_7_455aa864::operator()
              ((anon_class_56_7_455aa864 *)in_stack_fffffffffffffb38.bits,in_stack_fffffffffffffb30)
    ;
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::end
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)this_00);
    __gnu_cxx::
    __normal_iterator<pbrt::PrimitiveHandle_const*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>
    ::__normal_iterator<pbrt::PrimitiveHandle*>
              ((__normal_iterator<const_pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
                *)renderFromPrimitive,
               (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
                *)this_00);
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::begin
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)this_00);
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::end
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)this_00);
    std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
    insert<__gnu_cxx::__normal_iterator<pbrt::PrimitiveHandle*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>,void>
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
               in_stack_fffffffffffff930,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               in_stack_fffffffffffff938);
    bVar2 = std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::empty
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       in_stack_fffffffffffff900);
    if (bVar2) {
      PrimitiveHandle::TaggedPointer((PrimitiveHandle *)renderFromPrimitive,this_00);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                    *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      PrimitiveHandle::operator=((PrimitiveHandle *)renderFromPrimitive,&this_00->primitive);
    }
    else {
      sVar4 = std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
                        ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                         &stack0xfffffffffffffc28);
      if (1 < sVar4) {
        operator_new(0x30);
        std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
                  ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                   renderFromPrimitive,
                   (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)this_00)
        ;
        BVHAggregate::BVHAggregate
                  (in_stack_fffffffffffffbb0,
                   (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                   in_stack_fffffffffffffba8._M_current,
                   (int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                   (SplitMethod)in_stack_fffffffffffffba0);
        PrimitiveHandle::TaggedPointer<pbrt::BVHAggregate>
                  ((PrimitiveHandle *)renderFromPrimitive,(BVHAggregate *)this_00);
        std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
                  ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                   in_stack_fffffffffffff900);
        std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::clear
                  ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)0x519090
                  );
        std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::push_back
                  ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                   in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
      }
      in_stack_fffffffffffff978.memoryResource =
           (memory_resource *)
           std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                     ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                      &stack0xfffffffffffffc28,0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                    *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      PrimitiveHandle::operator=((PrimitiveHandle *)renderFromPrimitive,&this_00->primitive);
    }
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
               in_stack_fffffffffffff900);
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
               in_stack_fffffffffffff900);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>
                  *)renderFromPrimitive);
  }
  ErrorExit<std::__cxx11::string_const&>
            ((char *)CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,
                                       CONCAT15(in_stack_fffffffffffff925,
                                                CONCAT14(in_stack_fffffffffffff924,
                                                         CONCAT13(in_stack_fffffffffffff923,
                                                                  CONCAT12(in_stack_fffffffffffff922
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff921,
                                                  in_stack_fffffffffffff920))))))),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff91f,
                      CONCAT16(in_stack_fffffffffffff91e,in_stack_fffffffffffff918)));
}

Assistant:

void CPURender(ParsedScene &parsedScene) {
    Allocator alloc;

    // Create media first (so have them for the camera...)
    std::map<std::string, MediumHandle> media = parsedScene.CreateMedia(alloc);

    bool haveScatteringMedia = false;
    auto findMedium = [&media, &haveScatteringMedia](const std::string &s,
                                                     const FileLoc *loc) -> MediumHandle {
        if (s.empty())
            return nullptr;

        auto iter = media.find(s);
        if (iter == media.end())
            ErrorExit(loc, "%s: medium not defined", s);
        haveScatteringMedia = true;
        return iter->second;
    };

    // Filter
    FilterHandle filter =
        FilterHandle::Create(parsedScene.filter.name, parsedScene.filter.parameters,
                             &parsedScene.filter.loc, alloc);

    // Film
    // It's a little ugly to poke into the camera's parameters here, but we
    // have this circular dependency that CameraHandle::Create() expects a
    // FilmHandle, yet now the film needs to know the exposure time from
    // the camera....
    Float exposureTime = parsedScene.camera.parameters.GetOneFloat("shutterclose", 1.f) -
                         parsedScene.camera.parameters.GetOneFloat("shutteropen", 0.f);
    if (exposureTime <= 0)
        ErrorExit(&parsedScene.camera.loc,
                  "The specified camera shutter times imply that the shutter "
                  "does not open.  A black image will result.");
    FilmHandle film =
        FilmHandle::Create(parsedScene.film.name, parsedScene.film.parameters,
                           exposureTime, filter, &parsedScene.film.loc, alloc);

    // Camera
    MediumHandle cameraMedium =
        findMedium(parsedScene.camera.medium, &parsedScene.camera.loc);
    CameraHandle camera = CameraHandle::Create(
        parsedScene.camera.name, parsedScene.camera.parameters, cameraMedium,
        parsedScene.camera.cameraTransform, film, &parsedScene.camera.loc, alloc);

    // Create _Sampler_ for rendering
    SamplerHandle sampler = SamplerHandle::Create(
        parsedScene.sampler.name, parsedScene.sampler.parameters,
        camera.GetFilm().FullResolution(), &parsedScene.sampler.loc, alloc);

    // Textures
    std::map<std::string, FloatTextureHandle> floatTextures;
    std::map<std::string, SpectrumTextureHandle> spectrumTextures;
    parsedScene.CreateTextures(&floatTextures, &spectrumTextures, alloc, false);

    // Materials
    std::map<std::string, MaterialHandle> namedMaterials;
    std::vector<MaterialHandle> materials;
    parsedScene.CreateMaterials(floatTextures, spectrumTextures, alloc, &namedMaterials,
                                &materials);
    bool haveSubsurface = false;
    for (const auto &mtl : parsedScene.materials)
        if (mtl.name == "subsurface")
            haveSubsurface = true;
    for (const auto &namedMtl : parsedScene.namedMaterials)
        if (namedMtl.second.name == "subsurface")
            haveSubsurface = true;

    // Lights (area lights will be done later, with shapes...)
    std::vector<LightHandle> lights;
    lights.reserve(parsedScene.lights.size() + parsedScene.areaLights.size());
    for (const auto &light : parsedScene.lights) {
        MediumHandle outsideMedium = findMedium(light.medium, &light.loc);
        if (light.renderFromObject.IsAnimated())
            Warning(&light.loc,
                    "Animated lights aren't supported. Using the start transform.");
        LightHandle l = LightHandle::Create(
            light.name, light.parameters, light.renderFromObject.startTransform,
            parsedScene.camera.cameraTransform, outsideMedium, &light.loc, alloc);
        lights.push_back(l);
    }

    // Primitives
    auto getAlphaTexture = [&](const ParameterDictionary &parameters,
                               const FileLoc *loc) -> FloatTextureHandle {
        std::string alphaTexName = parameters.GetTexture("alpha");
        if (!alphaTexName.empty()) {
            if (floatTextures.find(alphaTexName) != floatTextures.end())
                return floatTextures[alphaTexName];
            else
                ErrorExit(loc, "%s: couldn't find float texture for \"alpha\" parameter.",
                          alphaTexName);
        } else if (parameters.GetOneFloat("alpha", 1.f) == 0.f)
            return alloc.new_object<FloatConstantTexture>(0.f);
        else
            return nullptr;
    };

    // Non-animated shapes
    auto CreatePrimitivesForShapes =
        [&](const std::vector<ShapeSceneEntity> &shapes) -> std::vector<PrimitiveHandle> {
        std::vector<PrimitiveHandle> primitives;
        for (const auto &sh : shapes) {
            pstd::vector<ShapeHandle> shapes =
                ShapeHandle::Create(sh.name, sh.renderFromObject, sh.objectFromRender,
                                    sh.reverseOrientation, sh.parameters, &sh.loc, alloc);
            if (shapes.empty())
                continue;

            FloatTextureHandle alphaTex = getAlphaTexture(sh.parameters, &sh.loc);
            sh.parameters.ReportUnused();  // do now so can grab alpha...

            MaterialHandle mtl = nullptr;
            if (!sh.materialName.empty()) {
                auto iter = namedMaterials.find(sh.materialName);
                if (iter == namedMaterials.end())
                    ErrorExit(&sh.loc, "%s: no named material defined.", sh.materialName);
                mtl = iter->second;
            } else {
                CHECK_LT(sh.materialIndex, materials.size());
                mtl = materials[sh.materialIndex];
            }

            MediumInterface mi(findMedium(sh.insideMedium, &sh.loc),
                               findMedium(sh.outsideMedium, &sh.loc));

            for (auto &s : shapes) {
                // Possibly create area light for shape
                LightHandle areaHandle = nullptr;
                if (sh.lightIndex != -1) {
                    CHECK_LT(sh.lightIndex, parsedScene.areaLights.size());
                    const auto &areaLightEntity = parsedScene.areaLights[sh.lightIndex];

                    LightHandle area = LightHandle::CreateArea(
                        areaLightEntity.name, areaLightEntity.parameters,
                        *sh.renderFromObject, mi, s, &areaLightEntity.loc, Allocator{});
                    areaHandle = area;
                    if (area)
                        lights.push_back(area);
                }
                if (areaHandle == nullptr && !mi.IsMediumTransition() && !alphaTex)
                    primitives.push_back(new SimplePrimitive(s, mtl));
                else
                    primitives.push_back(
                        new GeometricPrimitive(s, mtl, areaHandle, mi, alphaTex));
            }
        }
        return primitives;
    };

    std::vector<PrimitiveHandle> primitives =
        CreatePrimitivesForShapes(parsedScene.shapes);

    // Animated shapes
    auto CreatePrimitivesForAnimatedShapes =
        [&](const std::vector<AnimatedShapeSceneEntity> &shapes)
        -> std::vector<PrimitiveHandle> {
        std::vector<PrimitiveHandle> primitives;
        primitives.reserve(shapes.size());

        for (const auto &sh : shapes) {
            pstd::vector<ShapeHandle> shapes =
                ShapeHandle::Create(sh.name, sh.identity, sh.identity,
                                    sh.reverseOrientation, sh.parameters, &sh.loc, alloc);
            if (shapes.empty())
                continue;

            FloatTextureHandle alphaTex = getAlphaTexture(sh.parameters, &sh.loc);
            sh.parameters.ReportUnused();  // do now so can grab alpha...

            // Create initial shape or shapes for animated shape

            MaterialHandle mtl = nullptr;
            if (!sh.materialName.empty()) {
                auto iter = namedMaterials.find(sh.materialName);
                if (iter == namedMaterials.end())
                    ErrorExit(&sh.loc, "%s: no named material defined.", sh.materialName);
                mtl = iter->second;
            } else {
                CHECK_LT(sh.materialIndex, materials.size());
                mtl = materials[sh.materialIndex];
            }

            MediumInterface mi(findMedium(sh.insideMedium, &sh.loc),
                               findMedium(sh.outsideMedium, &sh.loc));

            std::vector<PrimitiveHandle> prims;
            for (auto &s : shapes) {
                // Possibly create area light for shape
                LightHandle areaHandle = nullptr;
                if (sh.lightIndex != -1) {
                    CHECK_LT(sh.lightIndex, parsedScene.areaLights.size());
                    const auto &areaLightEntity = parsedScene.areaLights[sh.lightIndex];

                    if (sh.renderFromObject.IsAnimated())
                        Warning(&sh.loc, "Animated area lights aren't supported. Using "
                                         "the start transform.");

                    LightHandle area = LightHandle::CreateArea(
                        areaLightEntity.name, areaLightEntity.parameters,
                        sh.renderFromObject.startTransform, mi, s, &sh.loc, Allocator{});
                    areaHandle = area;
                    if (area)
                        lights.push_back(area);
                }
                if (areaHandle == nullptr && !mi.IsMediumTransition() && !alphaTex)
                    prims.push_back(new SimplePrimitive(s, mtl));
                else
                    prims.push_back(
                        new GeometricPrimitive(s, mtl, areaHandle, mi, alphaTex));
            }

            // TODO: could try to be greedy or even segment them according
            // to same sh.renderFromObject...

            // Create single _Primitive_ for _prims_
            if (prims.size() > 1) {
                PrimitiveHandle bvh = new BVHAggregate(std::move(prims));
                prims.clear();
                prims.push_back(bvh);
            }
            primitives.push_back(new AnimatedPrimitive(prims[0], sh.renderFromObject));
        }
        return primitives;
    };
    std::vector<PrimitiveHandle> animatedPrimitives =
        CreatePrimitivesForAnimatedShapes(parsedScene.animatedShapes);
    primitives.insert(primitives.end(), animatedPrimitives.begin(),
                      animatedPrimitives.end());

    // Instance definitions
    std::map<std::string, PrimitiveHandle> instanceDefinitions;
    for (const auto &inst : parsedScene.instanceDefinitions) {
        if (instanceDefinitions.find(inst.first) != instanceDefinitions.end())
            ErrorExit("%s: object instance redefined", inst.first);

        std::vector<PrimitiveHandle> instancePrimitives =
            CreatePrimitivesForShapes(inst.second.shapes);
        std::vector<PrimitiveHandle> movingInstancePrimitives =
            CreatePrimitivesForAnimatedShapes(inst.second.animatedShapes);
        instancePrimitives.insert(instancePrimitives.end(),
                                  movingInstancePrimitives.begin(),
                                  movingInstancePrimitives.end());
        if (instancePrimitives.empty()) {
            instanceDefinitions[inst.first] = nullptr;
        } else {
            if (instancePrimitives.size() > 1) {
                PrimitiveHandle bvh = new BVHAggregate(std::move(instancePrimitives));
                instancePrimitives.clear();
                instancePrimitives.push_back(bvh);
            }
            instanceDefinitions[inst.first] = instancePrimitives[0];
        }
    }

    // Instances
    for (const auto &inst : parsedScene.instances) {
        auto iter = instanceDefinitions.find(inst.name);
        if (iter == instanceDefinitions.end())
            ErrorExit(&inst.loc, "%s: object instance not defined", inst.name);

        if (iter->second == nullptr)
            // empty instance
            continue;

        if (inst.renderFromInstance)
            primitives.push_back(
                new TransformedPrimitive(iter->second, inst.renderFromInstance));
        else
            primitives.push_back(
                new AnimatedPrimitive(iter->second, inst.renderFromInstanceAnim));
    }

    // Accelerator
    PrimitiveHandle accel = nullptr;
    if (!primitives.empty())
        accel = CreateAccelerator(parsedScene.accelerator.name, std::move(primitives),
                                  parsedScene.accelerator.parameters);

    // Integrator
    const RGBColorSpace *integratorColorSpace = parsedScene.film.parameters.ColorSpace();
    std::unique_ptr<Integrator> integrator(Integrator::Create(
        parsedScene.integrator.name, parsedScene.integrator.parameters, camera, sampler,
        accel, lights, integratorColorSpace, &parsedScene.integrator.loc));

    // Helpful warnings
    if (haveScatteringMedia && parsedScene.integrator.name != "volpath" &&
        parsedScene.integrator.name != "simplevolpath" &&
        parsedScene.integrator.name != "bdpt" && parsedScene.integrator.name != "mlt")
        Warning("Scene has scattering media but \"%s\" integrator doesn't support "
                "volume scattering. Consider using \"volpath\", \"simplevolpath\", "
                "\"bdpt\", or \"mlt\".",
                parsedScene.integrator.name);

    bool haveLights = !lights.empty();
    for (const auto &m : media)
        haveLights |= m.second.IsEmissive();

    if (!haveLights && parsedScene.integrator.name != "ambientocclusion" &&
        parsedScene.integrator.name != "aov")
        Warning("No light sources defined in scene; rendering a black image.");

    if (parsedScene.film.name == "gbuffer" && parsedScene.integrator.name != "path")
        Warning(&parsedScene.film.loc,
                "GBufferFilm is not supported by %s. The channels "
                "other than R, G, B will be zero.",
                parsedScene.integrator.name);

    if (haveSubsurface && parsedScene.integrator.name != "volpath")
        Warning("Some objects in the scene have subsurface scattering, which is "
                "not supported by the %s integrator. Use the \"volpath\" integrator "
                "to render them correctly.",
                parsedScene.integrator.name);

    LOG_VERBOSE("Memory used after scene creation: %d", GetCurrentRSS());

    // Render!
    integrator->Render();

    LOG_VERBOSE("Memory used after rendering: %s", GetCurrentRSS());

    PtexTextureBase::ReportStats();
    ImageTextureBase::ClearCache();
    FreeBufferCaches();
}